

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtrie.c
# Opt level: O0

void yatrie_get_word_nodes(word_nodes_s *res,uint8_t *word,uint32_t parent_id,trie_s *trie)

{
  byte bVar1;
  uint32_t *bitmask;
  uint local_9c;
  uint32_t *puStack_98;
  uint32_t j;
  node_s *parent_node;
  byte local_88 [3];
  uint8_t pos;
  uint32_t i;
  uint8_t indexes [96];
  trie_s *trie_local;
  uint32_t parent_id_local;
  uint8_t *word_local;
  word_nodes_s *res_local;
  
  indexes._88_8_ = trie;
  memset(local_88,0,0x60);
  encode_string(local_88,word);
  bitmask = (uint32_t *)(*(long *)indexes._88_8_ + 8 + (ulong)parent_id * 0x10);
  parent_node._4_4_ = 1;
  bVar1 = bit_int32_count(bitmask,'\x01',local_88[0] - 1);
  trie_local._4_4_ =
       *(uint *)(*(long *)(indexes._88_8_ + 8) + 8 + (ulong)(bitmask[3] + (uint)bVar1) * 4);
  puStack_98 = (uint32_t *)(*(long *)indexes._88_8_ + 8 + (ulong)trie_local._4_4_ * 0x10);
  local_9c = 0;
  while( true ) {
    if (local_88[local_9c] == 0) {
      return;
    }
    if ((*puStack_98 & 1) == 0) {
      res->letters[local_9c] = -1;
    }
    else {
      res->letters[local_9c] = '\x01';
    }
    res->length = res->length + '\x01';
    res->nodes[local_9c] = trie_local._4_4_;
    bit_array_rest = local_88[parent_node._4_4_] & 0x1f;
    bVar1 = bit_array_rest;
    if (bit_array_rest == 0) {
      bVar1 = 0;
    }
    if ((puStack_98[(int)(local_88[parent_node._4_4_] - 1) >> 5] >> (bVar1 - 1 & 0x1f) & 1) == 0)
    break;
    bVar1 = bit_int32_count(puStack_98,'\x01',local_88[parent_node._4_4_] - 1);
    trie_local._4_4_ =
         *(uint *)(*(long *)(indexes._88_8_ + 8) + 8 + (ulong)(puStack_98[3] + (uint)bVar1) * 4);
    puStack_98 = (uint32_t *)(*(long *)indexes._88_8_ + 8 + (ulong)trie_local._4_4_ * 0x10);
    parent_node._4_4_ = parent_node._4_4_ + 1;
    local_9c = local_9c + 1;
  }
  return;
}

Assistant:

void yatrie_get_word_nodes(word_nodes_s *res, uint8_t *word, uint32_t parent_id, trie_s *trie) {
    uint8_t indexes[MASK_BITS] = {}; //array to store bitmask
    uint32_t i = 0;
    uint8_t pos = 0;

    encode_string(indexes, word);
    node_s *parent_node = NODE_GET(parent_id, trie);

    //first node
    pos = bit_int32_count(parent_node->mask, 1, indexes[i++] - 1);
    parent_id = REF_GET(parent_node->ref_id, pos, trie);
    parent_node = NODE_GET(parent_id, trie);

    //cycle starts from the second node
    for (uint32_t j = 0; indexes[j]; ++i, ++j) {

        if(IS_LEAF(parent_node)){
            res->letters[j] = 1;
        } else {
            res->letters[j] = -1;
        }
        ++res->length;
        res->nodes[j] = parent_id;

        //if char exists in the bitmask we need to get next node_s id from the references block
        if (LIKELY(BIT_ARRAY_GET(parent_node->mask, indexes[i]))) {
            //number of chars (bits) before the current char (bit) position in the alphabet
            //count the number of bits before char to determine its position
            pos = bit_int32_count(parent_node->mask, 1, indexes[i] - 1);
            parent_id = REF_GET(parent_node->ref_id, pos, trie);
            parent_node = NODE_GET(parent_id, trie);
        } else {
            return;
        }

    }
    return;
}